

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FatUtils.h
# Opt level: O2

string * prettySize_abi_cxx11_(string *__return_storage_ptr__,unsigned_long_long bytes)

{
  ostream *poVar1;
  char *pcVar2;
  undefined1 auVar3 [16];
  double dVar4;
  ostringstream oss;
  ostringstream local_190 [376];
  
  auVar3._8_4_ = (int)(bytes >> 0x20);
  auVar3._0_8_ = bytes;
  auVar3._12_4_ = 0x45300000;
  pcVar2 = "BKMGTP";
  for (dVar4 = (auVar3._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)bytes) - 4503599627370496.0); 1024.0 <= dVar4;
      dVar4 = dVar4 * 0.0009765625) {
    pcVar2 = pcVar2 + 1;
  }
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::ostream::_M_insert<double>(dVar4);
  std::operator<<(poVar1,*pcVar2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

static inline string prettySize(unsigned long long bytes)
{
    double size = bytes;
    int n = 0;

    while (size >= 1024) {
        size /= 1024;
        n++;
    }

  ostringstream oss;
  oss << size << units[n];

  return oss.str();
}